

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWSImporter::BuildGraph
          (LWSImporter *this,aiNode *nd,NodeDesc *src,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          BatchLoader *batch,aiCamera ***camOut,aiLight ***lightOut,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *animOut)

{
  float fVar1;
  aiLight **ppaVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  BatchLoader *this_00;
  bool bVar5;
  long lVar6;
  Logger *this_01;
  void *pvVar7;
  aiNode *paVar8;
  aiLight *this_02;
  aiColor3D *o;
  aiCamera *this_03;
  size_type sVar9;
  ulong uVar10;
  reference ppNVar11;
  aiNode *ndd;
  _Self local_1b8;
  iterator it;
  aiNodeAnim *anim;
  AnimResolver resolver;
  aiCamera *cam;
  aiLight *local_e0;
  aiLight *lit;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  aiNode *local_80;
  aiNode *newRootNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  aiScene *local_48;
  aiScene *obj;
  aiNode *ndAnim;
  aiCamera ***camOut_local;
  BatchLoader *batch_local;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach_local;
  NodeDesc *src_local;
  aiNode *nd_local;
  LWSImporter *this_local;
  
  ndAnim = (aiNode *)camOut;
  camOut_local = (aiCamera ***)batch;
  batch_local = (BatchLoader *)attach;
  attach_local = (vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)src;
  src_local = (NodeDesc *)nd;
  nd_local = (aiNode *)this;
  SetupNodeName(this,nd,src);
  obj = (aiScene *)src_local;
  if (*(int *)&(attach_local->
               super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
               _M_impl.super__Vector_impl_data._M_start == 1) {
    local_48 = (aiScene *)0x0;
    lVar6 = std::__cxx11::string::length();
    if (lVar6 != 0) {
      local_48 = BatchLoader::GetImport
                           ((BatchLoader *)camOut_local,
                            *(uint *)&attach_local[1].
                                      super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_48 == (aiScene *)0x0) {
        this_01 = DefaultLogger::get();
        std::operator+(&local_68,"LWS: Failed to read external file ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(attach_local->
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        )._M_impl.super__Vector_impl_data._M_finish);
        Logger::error(this_01,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
      else if (local_48->mRootNode->mNumChildren == 1) {
        if (((ulong)attach_local[4].
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x100000000) == 0) {
          *(float *)&attach_local[3].
                     super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (local_48->mRootNode->mTransformation).a4;
          *(float *)((long)&attach_local[3].
                            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
               (local_48->mRootNode->mTransformation).b4;
          *(float *)&attach_local[4].
                     super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start =
               -(local_48->mRootNode->mTransformation).c4;
        }
        local_80 = *local_48->mRootNode->mChildren;
        *local_48->mRootNode->mChildren = (aiNode *)0x0;
        paVar8 = local_48->mRootNode;
        if (paVar8 != (aiNode *)0x0) {
          aiNode::~aiNode(paVar8);
          operator_delete(paVar8,0x478);
        }
        local_48->mRootNode = local_80;
        (local_48->mRootNode->mTransformation).a4 = 0.0;
        (local_48->mRootNode->mTransformation).b4 = 0.0;
        (local_48->mRootNode->mTransformation).c4 = 0.0;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Pivot:",&local_c1);
    std::operator+(&local_a0,&local_c0,&src_local->field_0x4);
    aiString::operator=((aiString *)src_local,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    obj = (aiScene *)src_local;
    src_local[6].pivotPos.z = 1.4013e-45;
    pvVar7 = operator_new__(8);
    *(void **)&src_local[6].lightColor = pvVar7;
    paVar8 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar8);
    **(undefined8 **)&src_local[6].lightColor = paVar8;
    *(NodeDesc **)(**(long **)&src_local[6].lightColor + 0x448) = src_local;
    *(uint *)(**(long **)&src_local[6].lightColor + 0x410) =
         *(uint *)&attach_local[3].
                   super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage ^ 0x80000000;
    *(uint *)(**(long **)&src_local[6].lightColor + 0x420) =
         *(uint *)((long)&attach_local[3].
                          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) ^ 0x80000000;
    *(uint *)(**(long **)&src_local[6].lightColor + 0x430) =
         *(uint *)&attach_local[4].
                   super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start ^ 0x80000000;
    SetupNodeName(this,(aiNode *)**(undefined8 **)&src_local[6].lightColor,(NodeDesc *)attach_local)
    ;
    this_00 = batch_local;
    src_local = (NodeDesc *)**(undefined8 **)&src_local[6].lightColor;
    if (local_48 != (aiScene *)0x0) {
      AttachmentInfo::AttachmentInfo((AttachmentInfo *)&lit,local_48,(aiNode *)src_local);
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::push_back
                ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)this_00,
                 (value_type *)&lit);
    }
  }
  else if (*(int *)&(attach_local->
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start == 2) {
    this_02 = (aiLight *)operator_new(0x46c);
    aiLight::aiLight(this_02);
    ppaVar2 = *lightOut;
    *lightOut = ppaVar2 + 1;
    *ppaVar2 = this_02;
    local_e0 = this_02;
    aiColor3D::operator*
              ((aiColor3D *)((long)&cam + 4),
               *(ai_real *)
                ((long)&attach_local[4].
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    o = aiColor3D::operator=(&local_e0->mColorSpecular,(aiColor3D *)((long)&cam + 4));
    aiColor3D::operator=(&local_e0->mColorDiffuse,o);
    aiString::operator=(&local_e0->mName,(aiString *)src_local);
    if (*(int *)&attach_local[5].
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start == 2) {
      local_e0->mType = aiLightSource_SPOT;
      local_e0->mAngleInnerCone =
           *(float *)&attach_local[5].
                      super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish * 0.017453292;
      local_e0->mAngleOuterCone =
           *(float *)((long)&attach_local[5].
                             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) * 0.017453292 +
           local_e0->mAngleInnerCone;
    }
    else if (*(int *)&attach_local[5].
                      super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start == 1) {
      local_e0->mType = aiLightSource_DIRECTIONAL;
    }
    else {
      local_e0->mType = aiLightSource_POINT;
    }
    if (*(int *)((long)&attach_local[5].
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) == 1) {
      local_e0->mAttenuationConstant = 1.0;
    }
    else if (*(int *)((long)&attach_local[5].
                             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4) == 1) {
      local_e0->mAttenuationLinear = 1.0;
    }
    else {
      local_e0->mAttenuationQuadratic = 1.0;
    }
  }
  else if (*(int *)&(attach_local->
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start == 3) {
    this_03 = (aiCamera *)operator_new(0x438);
    aiCamera::aiCamera(this_03);
    puVar3 = *(undefined8 **)&ndAnim->mName;
    *(undefined8 **)&ndAnim->mName = puVar3 + 1;
    *puVar3 = this_03;
    resolver.sample_delta = (double)this_03;
    aiString::operator=((aiString *)this_03,(aiString *)src_local);
  }
  LWO::AnimResolver::AnimResolver
            ((AnimResolver *)&anim,
             (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
             &attach_local[2].
              super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,this->fps);
  LWO::AnimResolver::ExtractBindPose((AnimResolver *)&anim,(aiMatrix4x4 *)&obj[8].field_0x4);
  it._M_node = (_List_node_base *)0x0;
  if ((this->first != this->last) || (NAN(this->first) || NAN(this->last))) {
    LWO::AnimResolver::SetAnimationRange((AnimResolver *)&anim,this->first,this->last);
    LWO::AnimResolver::ExtractAnimChannel((AnimResolver *)&anim,(aiNodeAnim **)&it,3);
    if (it._M_node != (_List_node_base *)0x0) {
      aiString::operator=((aiString *)it._M_node,(aiString *)obj);
      std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(animOut,(value_type *)&it)
      ;
    }
  }
  bVar5 = std::__cxx11::list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>::
          empty((list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_> *)
                &attach_local[5].
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar5) {
    sVar9 = std::__cxx11::list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>::
            size((list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_> *)
                 &attach_local[5].
                  super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar9;
    uVar10 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar7 = operator_new__(uVar10);
    *(void **)&src_local[6].lightColor = pvVar7;
    local_1b8._M_node =
         (_List_node_base *)
         std::__cxx11::list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>::
         begin((list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_> *)
               &attach_local[5].
                super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      ndd = (aiNode *)
            std::__cxx11::list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>::
            end((list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_> *)
                &attach_local[5].
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar5 = std::operator!=(&local_1b8,(_Self *)&ndd);
      if (!bVar5) break;
      paVar8 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar8);
      lVar6 = *(long *)&src_local[6].lightColor;
      fVar1 = src_local[6].pivotPos.z;
      src_local[6].pivotPos.z = (float)((int)fVar1 + 1);
      *(aiNode **)(lVar6 + (ulong)(uint)fVar1 * 8) = paVar8;
      paVar8->mParent = (aiNode *)src_local;
      ppNVar11 = std::_List_iterator<Assimp::LWS::NodeDesc_*>::operator*(&local_1b8);
      BuildGraph(this,paVar8,*ppNVar11,
                 (vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                 batch_local,(BatchLoader *)camOut_local,(aiCamera ***)ndAnim,lightOut,animOut);
      std::_List_iterator<Assimp::LWS::NodeDesc_*>::operator++(&local_1b8);
    }
  }
  return;
}

Assistant:

void LWSImporter::BuildGraph(aiNode* nd, LWS::NodeDesc& src, std::vector<AttachmentInfo>& attach,
    BatchLoader& batch,
    aiCamera**& camOut,
    aiLight**& lightOut,
    std::vector<aiNodeAnim*>& animOut)
{
    // Setup a very cryptic name for the node, we want the user to be happy
    SetupNodeName(nd,src);
    aiNode* ndAnim = nd;

    // If the node is an object
    if (src.type == LWS::NodeDesc::OBJECT) {

        // If the object is from an external file, get it
        aiScene* obj = NULL;
        if (src.path.length() ) {
            obj = batch.GetImport(src.id);
            if (!obj) {
                ASSIMP_LOG_ERROR("LWS: Failed to read external file " + src.path);
            }
            else {
                if (obj->mRootNode->mNumChildren == 1) {

                    //If the pivot is not set for this layer, get it from the external object
                    if (!src.isPivotSet) {
                        src.pivotPos.x = +obj->mRootNode->mTransformation.a4;
                        src.pivotPos.y = +obj->mRootNode->mTransformation.b4;
                        src.pivotPos.z = -obj->mRootNode->mTransformation.c4; //The sign is the RH to LH back conversion
                    }

                    //Remove first node from obj (the old pivot), reset transform of second node (the mesh node)
                    aiNode* newRootNode = obj->mRootNode->mChildren[0];
                    obj->mRootNode->mChildren[0] = NULL;
                    delete obj->mRootNode;

                    obj->mRootNode = newRootNode;
                    obj->mRootNode->mTransformation.a4 = 0.0;
                    obj->mRootNode->mTransformation.b4 = 0.0;
                    obj->mRootNode->mTransformation.c4 = 0.0;
                }
            }
        }

        //Setup the pivot node (also the animation node), the one we received
        nd->mName = std::string("Pivot:") + nd->mName.data;
        ndAnim = nd;

        //Add the attachment node to it
        nd->mNumChildren = 1;
        nd->mChildren = new aiNode*[1];
        nd->mChildren[0] = new aiNode();
        nd->mChildren[0]->mParent = nd;
        nd->mChildren[0]->mTransformation.a4 = -src.pivotPos.x;
        nd->mChildren[0]->mTransformation.b4 = -src.pivotPos.y;
        nd->mChildren[0]->mTransformation.c4 = -src.pivotPos.z;
        SetupNodeName(nd->mChildren[0], src);

        //Update the attachment node
        nd = nd->mChildren[0];

        //Push attachment, if the object came from an external file
        if (obj) {
            attach.push_back(AttachmentInfo(obj,nd));
        }
    }

    // If object is a light source - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::LIGHT) {
        aiLight* lit = *lightOut++ = new aiLight();

        // compute final light color
        lit->mColorDiffuse = lit->mColorSpecular = src.lightColor*src.lightIntensity;

        // name to attach light to node -> unique due to LWs indexing system
        lit->mName = nd->mName;

        // determine light type and setup additional members
        if (src.lightType == 2) { /* spot light */

            lit->mType = aiLightSource_SPOT;
            lit->mAngleInnerCone = (float)AI_DEG_TO_RAD( src.lightConeAngle );
            lit->mAngleOuterCone = lit->mAngleInnerCone+(float)AI_DEG_TO_RAD( src.lightEdgeAngle );

        }
        else if (src.lightType == 1) { /* directional light source */
            lit->mType = aiLightSource_DIRECTIONAL;
        }
        else lit->mType = aiLightSource_POINT;

        // fixme: no proper handling of light falloffs yet
        if (src.lightFalloffType == 1)
            lit->mAttenuationConstant = 1.f;
        else if (src.lightFalloffType == 1)
            lit->mAttenuationLinear = 1.f;
        else
            lit->mAttenuationQuadratic = 1.f;
    }

    // If object is a camera - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::CAMERA) {
        aiCamera* cam = *camOut++ = new aiCamera();

        // name to attach cam to node -> unique due to LWs indexing system
        cam->mName = nd->mName;
    }

    // Get the node transformation from the LWO key
    LWO::AnimResolver resolver(src.channels,fps);
    resolver.ExtractBindPose(ndAnim->mTransformation);

    // .. and construct animation channels
    aiNodeAnim* anim = NULL;

    if (first != last) {
        resolver.SetAnimationRange(first,last);
        resolver.ExtractAnimChannel(&anim,AI_LWO_ANIM_FLAG_SAMPLE_ANIMS|AI_LWO_ANIM_FLAG_START_AT_ZERO);
        if (anim) {
            anim->mNodeName = ndAnim->mName;
            animOut.push_back(anim);
        }
    }

    // Add children
    if (!src.children.empty()) {
        nd->mChildren = new aiNode*[src.children.size()];
        for (std::list<LWS::NodeDesc*>::iterator it = src.children.begin(); it != src.children.end(); ++it) {
            aiNode* ndd = nd->mChildren[nd->mNumChildren++] = new aiNode();
            ndd->mParent = nd;

            BuildGraph(ndd,**it,attach,batch,camOut,lightOut,animOut);
        }
    }
}